

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::AssertionPrinter::printMessage(AssertionPrinter *this)

{
  size_type sVar1;
  pointer pbVar2;
  ostream *poVar3;
  pointer pbVar4;
  pointer pMVar5;
  Text local_b8;
  TextAttributes local_60;
  pointer local_40;
  AssertionPrinter *local_38;
  
  sVar1 = (this->messageLabel)._M_string_length;
  if (sVar1 != 0) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (this->stream,(this->messageLabel)._M_dataplus._M_p,sVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  }
  pMVar5 = (this->messages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_40 = (this->messages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_38 = this;
  if (pMVar5 != local_40) {
    do {
      if ((this->printInfoMessages != false) || (pMVar5->type != Info)) {
        poVar3 = this->stream;
        local_60.initialIndent = 0xffffffffffffffff;
        local_60.width = 0x4f;
        local_60.tabChar = '\t';
        local_60.indent = 2;
        Tbc::Text::Text(&local_b8,&pMVar5->message,&local_60);
        pbVar2 = local_b8.lines.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar4 = local_b8.lines.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar2;
            pbVar4 = pbVar4 + 1) {
          if (pbVar4 != local_b8.lines.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_b8.lines);
        this = local_38;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8.str._M_dataplus._M_p != &local_b8.str.field_2) {
          operator_delete(local_b8.str._M_dataplus._M_p,
                          local_b8.str.field_2._M_allocated_capacity + 1);
        }
      }
      pMVar5 = pMVar5 + 1;
    } while (pMVar5 != local_40);
  }
  return;
}

Assistant:

void printMessage() const {
                if( !messageLabel.empty() )
                    stream << messageLabel << ":" << "\n";
                for( std::vector<MessageInfo>::const_iterator it = messages.begin(), itEnd = messages.end();
                        it != itEnd;
                        ++it ) {
                    // If this assertion is a warning ignore any INFO messages
                    if( printInfoMessages || it->type != ResultWas::Info )
                        stream << Text( it->message, TextAttributes().setIndent(2) ) << "\n";
                }
            }